

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cc
# Opt level: O0

LogSeverityAtLeast absl::MinLogLevel(void)

{
  memory_order __b;
  
  std::operator&(memory_order_acquire,__memory_order_mask);
  return (anonymous_namespace)::min_log_level;
}

Assistant:

absl::LogSeverityAtLeast MinLogLevel() {
  return static_cast<absl::LogSeverityAtLeast>(
      min_log_level.load(std::memory_order_acquire));
}